

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteFixed64
               (int field_number,uint64_t value,CodedOutputStream *output)

{
  uint64_t *ptr;
  byte *ptr_00;
  ulong uVar1;
  uint uVar2;
  
  ptr_00 = output->cur_;
  if ((output->impl_).end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr_00);
  }
  uVar1 = (ulong)(field_number * 8 + 1);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar2 = (uint)uVar1;
      *ptr_00 = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      ptr_00 = ptr_00 + 1;
    } while (0x3fff < uVar2);
  }
  *ptr_00 = (byte)uVar1;
  ptr = (uint64_t *)(ptr_00 + 1);
  output->cur_ = (uint8_t *)ptr;
  if ((output->impl_).end_ <= ptr) {
    ptr = (uint64_t *)io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,(uint8_t *)ptr);
  }
  *ptr = value;
  output->cur_ = (uint8_t *)(ptr + 1);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64(int field_number, uint64_t value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteFixed64NoTag(value, output);
}